

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isCubeLevelSampleResultValid
               (ConstPixelBufferAccess (*level) [6],Sampler *sampler,FilterMode filterMode,
               LookupPrecision *prec,CubeFaceFloatCoords *coords,Vec4 *result)

{
  Sampler *pSVar1;
  TextureFormat format;
  TextureFormat format_00;
  TextureFormat format_01;
  TextureFormat format_02;
  undefined1 auVar2 [16];
  LookupPrecision *prec_00;
  Vec4 *xBounds;
  bool bVar3;
  TextureChannelClass TVar4;
  uint uVar5;
  Vec2 *yBounds;
  int iVar6;
  ulong uVar7;
  Vec4 *result_00;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  CubeFaceIntCoords CVar15;
  CubeFaceIntCoords CVar16;
  Vec2 vBounds;
  Vec2 uBounds;
  bool local_154;
  TextureFormat local_148;
  void *pvStack_140;
  uint local_134;
  int local_130;
  int local_12c;
  ulong local_128;
  float local_11c;
  float local_118;
  float local_114;
  ulong local_110;
  Vec4 *local_108;
  CubeFaceFloatCoords *local_100;
  Sampler *local_f8;
  LookupPrecision *local_f0;
  Vec4 *local_e8;
  long local_e0;
  ulong local_d8;
  int local_d0;
  float local_cc;
  TextureChannelClass local_c8;
  int local_c4;
  int local_c0;
  float local_bc;
  float local_b8;
  int local_b4;
  undefined1 local_b0 [16];
  float local_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  TextureFormat local_88;
  void *pvStack_80;
  TextureFormat local_78;
  void *pvStack_70;
  TextureFormat local_68;
  void *pvStack_60;
  ulong local_58;
  float local_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  if (filterMode == LINEAR) {
    if (sampler->seamlessCubeMap == true) {
      iVar6 = (*level)[coords->face].m_size.m_data[0];
      local_e8 = result;
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&local_50,sampler->normalizedCoords,iVar6,coords->s,
                 (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
      local_c0 = iVar6;
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&local_a0,sampler->normalizedCoords,iVar6,coords->t,
                 (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
      fVar10 = floorf(local_50 + -0.5);
      local_128 = CONCAT44(local_128._4_4_,fVar10);
      fVar10 = floorf(fStack_4c + -0.5);
      fVar11 = floorf(local_a0 + -0.5);
      local_110 = (ulong)(uint)(int)fVar11;
      fVar11 = floorf(fStack_9c + -0.5);
      local_108 = (Vec4 *)level;
      TVar4 = getTextureChannelClass((*level)[coords->face].m_format.type);
      if (TVar4 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
        computeBilinearSearchStepForSnorm(prec);
      }
      else if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
        computeBilinearSearchStepForUnorm(prec);
      }
      if ((int)fVar11 < (int)local_110) {
        local_154 = false;
      }
      else {
        local_cc = (float)(int)(float)local_128;
        local_c4 = (int)fVar10;
        local_100 = coords;
        local_f8 = sampler;
        local_f0 = prec;
        local_d0 = (int)fVar11;
        local_c8 = TVar4;
        do {
          local_11c = (float)((int)local_110 + 1);
          local_48 = ZEXT416((uint)(float)(int)local_110);
          fVar10 = local_cc;
          fVar11 = local_11c;
          while (iVar6 = local_c0, (int)fVar10 <= local_c4) {
            local_98._4_4_ = fVar10;
            local_98._0_4_ = coords->face;
            fVar12 = (float)local_110;
            local_98._8_4_ = fVar12;
            CVar15 = remapCubeEdgeCoords((CubeFaceIntCoords *)local_98,local_c0);
            local_b4 = CVar15.t;
            local_58 = CVar15._0_8_;
            local_98._4_4_ = (int)fVar10 + 1U;
            local_98._0_4_ = coords->face;
            local_98._8_4_ = fVar12;
            CVar15 = remapCubeEdgeCoords((CubeFaceIntCoords *)local_98,iVar6);
            fVar12 = local_11c;
            local_130 = CVar15.t;
            local_128 = CVar15._0_8_;
            local_98._4_4_ = fVar10;
            local_98._0_4_ = coords->face;
            local_98._8_4_ = local_11c;
            CVar15 = remapCubeEdgeCoords((CubeFaceIntCoords *)local_98,iVar6);
            local_12c = CVar15.t;
            local_98._4_4_ = (int)fVar10 + 1U;
            local_98._0_4_ = coords->face;
            local_98._8_4_ = fVar12;
            CVar16 = remapCubeEdgeCoords((CubeFaceIntCoords *)local_98,iVar6);
            local_134 = CVar16.t;
            local_e0 = CVar16._0_8_;
            uVar7 = local_58 & 0xffffffff;
            if ((uVar7 == 6) || (uVar9 = CVar15._0_8_ & 0xffffffff, CVar15.face == CUBEFACE_LAST)) {
              return true;
            }
            uVar8 = local_128 & 0xffffffff;
            if ((float)local_128 == 8.40779e-45) {
              return true;
            }
            local_d8 = (ulong)CVar16.face;
            if (CVar16.face == CUBEFACE_LAST) {
              return true;
            }
            fVar12 = (local_a0 + -0.5) - (float)local_48._0_4_;
            fVar13 = (local_50 + -0.5) - (float)(int)fVar10;
            fVar14 = (fStack_4c + -0.5) - (float)(int)fVar10;
            auVar2._4_4_ = -(uint)((fStack_9c + -0.5) - (float)local_48._0_4_ < 0.0);
            auVar2._0_4_ = -(uint)(fVar12 < 0.0);
            auVar2._8_4_ = -(uint)(fVar13 < 0.0);
            auVar2._12_4_ = -(uint)(fVar14 < 0.0);
            uVar5 = movmskps(fVar11,auVar2);
            local_114 = 0.0;
            if (((uVar5 & 4) == 0) && (local_114 = 1.0, fVar13 <= 1.0)) {
              local_114 = fVar13;
            }
            local_118 = 0.0;
            if (((uVar5 & 8) == 0) && (local_118 = 1.0, fVar14 <= 1.0)) {
              local_118 = fVar14;
            }
            local_bc = 0.0;
            if (((uVar5 & 1) == 0) && (local_bc = 1.0, fVar12 <= 1.0)) {
              local_bc = fVar12;
            }
            local_68.order = R;
            local_68.type = SNORM_INT8;
            pvStack_60 = (void *)0x0;
            local_78.order = R;
            local_78.type = SNORM_INT8;
            pvStack_70 = (void *)0x0;
            local_88.order = R;
            local_88.type = SNORM_INT8;
            pvStack_80 = (void *)0x0;
            pSVar1 = (Sampler *)((long)local_108 + uVar7 * 0x28);
            local_b8 = fVar10;
            if (((((long)local_58 < 0) ||
                 (iVar6 = (int)(local_58 >> 0x20),
                 *(int *)((long)local_108 + uVar7 * 0x28 + 8) <= iVar6)) || (local_b4 < 0)) ||
               (((int)pSVar1->minFilter <= local_b4 || ((int)pSVar1->magFilter < 1)))) {
              result_00 = local_108;
              sampleTextureBorder<float>(&local_148,pSVar1);
            }
            else {
              result_00 = (Vec4 *)0x0;
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_b0,(int)pSVar1,iVar6,local_b4);
              format.order = pSVar1->wrapS;
              format.type = pSVar1->wrapT;
              bVar3 = isSRGB(format);
              if (bVar3) {
                sRGBToLinear((tcu *)&local_148,(Vec4 *)local_b0);
              }
              else {
                local_148.order = local_b0._0_4_;
                local_148.type = local_b0._4_4_;
                pvStack_140 = (void *)local_b0._8_8_;
              }
            }
            xBounds = local_e8;
            local_98._0_4_ = local_148.order;
            local_98._4_4_ = local_148.type;
            local_98._8_8_ = pvStack_140;
            pSVar1 = (Sampler *)((long)local_108 + uVar8 * 0x28);
            if ((((long)local_128 < 0) ||
                (iVar6 = (int)(local_128 >> 0x20),
                *(int *)((long)local_108 + uVar8 * 0x28 + 8) <= iVar6)) ||
               ((local_130 < 0 ||
                (((int)pSVar1->minFilter <= local_130 || ((int)pSVar1->magFilter < 1)))))) {
              sampleTextureBorder<float>(&local_148,pSVar1);
            }
            else {
              result_00 = (Vec4 *)0x0;
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_b0,(int)pSVar1,iVar6,local_130);
              format_00.order = pSVar1->wrapS;
              format_00.type = pSVar1->wrapT;
              bVar3 = isSRGB(format_00);
              if (bVar3) {
                sRGBToLinear((tcu *)&local_148,(Vec4 *)local_b0);
              }
              else {
                local_148.order = local_b0._0_4_;
                local_148.type = local_b0._4_4_;
                pvStack_140 = (void *)local_b0._8_8_;
              }
            }
            coords = local_100;
            local_78 = local_148;
            pvStack_70 = pvStack_140;
            pSVar1 = (Sampler *)((long)local_108 + uVar9 * 0x28);
            if (((((long)CVar15._0_8_ < 0) ||
                 (*(int *)((long)local_108 + uVar9 * 0x28 + 8) <= CVar15.s)) || (local_12c < 0)) ||
               (((int)pSVar1->minFilter <= local_12c || ((int)pSVar1->magFilter < 1)))) {
              sampleTextureBorder<float>(&local_148,pSVar1);
            }
            else {
              result_00 = (Vec4 *)0x0;
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_b0,(int)pSVar1,CVar15.s,local_12c);
              format_01.order = pSVar1->wrapS;
              format_01.type = pSVar1->wrapT;
              bVar3 = isSRGB(format_01);
              if (bVar3) {
                sRGBToLinear((tcu *)&local_148,(Vec4 *)local_b0);
              }
              else {
                local_148.order = local_b0._0_4_;
                local_148.type = local_b0._4_4_;
                pvStack_140 = (void *)local_b0._8_8_;
              }
            }
            TVar4 = local_c8;
            prec_00 = local_f0;
            yBounds = (Vec2 *)(ulong)local_134;
            local_88 = local_148;
            pvStack_80 = pvStack_140;
            pSVar1 = (Sampler *)((long)local_108 + local_d8 * 0x28);
            if (((local_e0 < 0) ||
                (iVar6 = (int)((ulong)local_e0 >> 0x20),
                *(int *)((long)local_108 + local_d8 * 0x28 + 8) <= iVar6)) ||
               (((int)local_134 < 0 ||
                (((int)pSVar1->minFilter <= (int)local_134 || ((int)pSVar1->magFilter < 1)))))) {
              sampleTextureBorder<float>(&local_148,pSVar1);
            }
            else {
              result_00 = (Vec4 *)0x0;
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_b0,(int)pSVar1,iVar6,local_134);
              format_02.order = pSVar1->wrapS;
              format_02.type = pSVar1->wrapT;
              bVar3 = isSRGB(format_02);
              if (bVar3) {
                sRGBToLinear((tcu *)&local_148,(Vec4 *)local_b0);
              }
              else {
                local_148.order = local_b0._0_4_;
                local_148.type = local_b0._4_4_;
                pvStack_140 = (void *)local_b0._8_8_;
              }
            }
            local_68 = local_148;
            pvStack_60 = pvStack_140;
            if (TVar4 == TEXTURECHANNELCLASS_FLOATING_POINT) {
              computeBilinearSearchStepFromFloatQuad(prec_00,(ColorQuad *)local_98);
            }
            bVar3 = isBilinearRangeValid
                              (prec_00,(ColorQuad *)local_98,(Vec2 *)xBounds,yBounds,local_114,
                               result_00);
            fVar10 = (float)((int)local_b8 + 1);
            fVar11 = fVar10;
            if (bVar3) {
              return true;
            }
          }
          local_154 = false;
          local_110 = (ulong)(uint)local_11c;
        } while ((int)local_11c <= local_d0);
      }
    }
    else {
      local_98._0_4_ = coords->s;
      local_98._4_4_ = coords->t;
      local_154 = isLinearSampleResultValid
                            (*level + coords->face,sampler,prec,(Vec2 *)local_98,0,result);
    }
  }
  else {
    local_98._0_4_ = coords->s;
    local_98._4_4_ = coords->t;
    local_154 = isNearestSampleResultValid<tcu::LookupPrecision,float>
                          (*level + coords->face,sampler,prec,(Vec2 *)local_98,0,result);
  }
  return local_154;
}

Assistant:

static bool isCubeLevelSampleResultValid (const ConstPixelBufferAccess		(&level)[CUBEFACE_LAST],
										  const Sampler&					sampler,
										  const Sampler::FilterMode			filterMode,
										  const LookupPrecision&			prec,
										  const CubeFaceFloatCoords&		coords,
										  const Vec4&						result)
{
	if (filterMode == Sampler::LINEAR)
	{
		if (sampler.seamlessCubeMap)
			return isSeamlessLinearSampleResultValid(level, sampler, prec, coords, result);
		else
			return isLinearSampleResultValid(level[coords.face], sampler, prec, Vec2(coords.s, coords.t), 0, result);
	}
	else
		return isNearestSampleResultValid(level[coords.face], sampler, prec, Vec2(coords.s, coords.t), 0, result);
}